

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O2

void __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>_>::~rt_latex_translator
          (rt_latex_translator<viennamath::rt_expression_interface<double>_> *this)

{
  pointer pprVar1;
  
  for (pprVar1 = (this->processors_).
                 super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pprVar1 !=
      (this->processors_).
      super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; pprVar1 = pprVar1 + 1) {
    if (*pprVar1 !=
        (rt_latex_processor_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
      (*(*pprVar1)->_vptr_rt_latex_processor_interface[4])();
    }
  }
  std::
  _Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
  ::~_Vector_base((_Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
                   *)this);
  return;
}

Assistant:

~rt_latex_translator()
      {
        for (typename ProcessorArray::iterator it = processors_.begin();
                                               it != processors_.end();
                                             ++it)
        {
          delete *it;
        }
      }